

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVector<slang::ast::NetAlias,_2UL>::SmallVector
          (SmallVector<slang::ast::NetAlias,_2UL> *this,Base *other)

{
  move_iterator<slang::ast::NetAlias_*> first;
  size_type sVar1;
  
  (this->super_SmallVectorBase<slang::ast::NetAlias>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::ast::NetAlias>).firstElement;
  (this->super_SmallVectorBase<slang::ast::NetAlias>).len = 0;
  (this->super_SmallVectorBase<slang::ast::NetAlias>).cap = 0;
  first._M_current = other->data_;
  if (first._M_current == (NetAlias *)other->firstElement) {
    (this->super_SmallVectorBase<slang::ast::NetAlias>).cap = 2;
    SmallVectorBase<slang::ast::NetAlias>::append<std::move_iterator<slang::ast::NetAlias_*>_>
              (&this->super_SmallVectorBase<slang::ast::NetAlias>,first,
               first._M_current + other->len);
    other->len = 0;
  }
  else {
    other->data_ = (pointer)0x0;
    (this->super_SmallVectorBase<slang::ast::NetAlias>).data_ = first._M_current;
    sVar1 = other->len;
    other->len = 0;
    (this->super_SmallVectorBase<slang::ast::NetAlias>).len = sVar1;
    sVar1 = other->cap;
    other->cap = 0;
    (this->super_SmallVectorBase<slang::ast::NetAlias>).cap = sVar1;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }